

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  RepeatedField<int> *pRVar1;
  Extension *pEVar2;
  bool bVar3;
  int iVar4;
  Type TVar5;
  CppType CVar6;
  int64 iVar7;
  LogMessage *pLVar8;
  Descriptor *pDVar9;
  undefined8 uVar10;
  LogFinisher local_102;
  byte local_101;
  LogMessage local_100;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  long *local_88;
  MessageLite *prototype;
  byte local_69;
  LogMessage local_68;
  Extension *local_30;
  Extension *extension;
  MessageFactory *factory_local;
  FieldDescriptor *descriptor_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)factory;
  factory_local = (MessageFactory *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  iVar4 = FieldDescriptor::number(descriptor);
  bVar3 = MaybeNewExtension(this,iVar4,(FieldDescriptor *)factory_local,&local_30);
  if (bVar3) {
    TVar5 = FieldDescriptor::type((FieldDescriptor *)factory_local);
    local_30->type = (FieldType)TVar5;
    CVar6 = cpp_type(local_30->type);
    local_69 = 0;
    if (CVar6 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0x8f);
      local_69 = 1;
      pLVar8 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type(extension->type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)((long)&prototype + 3),pLVar8);
    }
    if ((local_69 & 1) != 0) {
      LogMessage::~LogMessage(&local_68);
    }
    pEVar2 = extension;
    local_30->is_repeated = false;
    local_30->is_packed = false;
    pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)factory_local);
    local_88 = (long *)(*(code *)(((pEVar2->field_0).string_value)->field_2)._M_allocated_capacity)
                                 (pEVar2,pDVar9);
    local_30->field_0xa = local_30->field_0xa & 0xf;
    iVar7 = (**(code **)(*local_88 + 0x18))();
    (local_30->field_0).int64_value = iVar7;
    local_30->field_0xa = local_30->field_0xa & 0xf0;
    this_local = (ExtensionSet *)(local_30->field_0).string_value;
  }
  else {
    iVar4 = 1;
    if ((local_30->is_repeated & 1U) != 0) {
      iVar4 = 3;
    }
    local_c1 = 0;
    if (iVar4 != 1) {
      LogMessage::LogMessage
                (&local_c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0x99);
      local_c1 = 1;
      pLVar8 = LogMessage::operator<<
                         (&local_c0,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=(&local_c2,pLVar8);
    }
    if ((local_c1 & 1) != 0) {
      LogMessage::~LogMessage(&local_c0);
    }
    CVar6 = cpp_type(local_30->type);
    local_101 = 0;
    if (CVar6 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0x99);
      local_101 = 1;
      pLVar8 = LogMessage::operator<<
                         (&local_100,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_102,pLVar8);
    }
    if ((local_101 & 1) != 0) {
      LogMessage::~LogMessage(&local_100);
    }
    pEVar2 = extension;
    local_30->field_0xa = local_30->field_0xa & 0xf0;
    if (((byte)local_30->field_0xa >> 4 & 1) == 0) {
      this_local = (ExtensionSet *)(local_30->field_0).string_value;
    }
    else {
      pRVar1 = (local_30->field_0).repeated_int32_value;
      pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)factory_local);
      uVar10 = (*(code *)(((pEVar2->field_0).string_value)->field_2)._M_allocated_capacity)
                         (pEVar2,pDVar9);
      this_local = (ExtensionSet *)(**(code **)(pRVar1->elements_ + 8))(pRVar1,uVar10);
    }
  }
  return (MessageLite *)this_local;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_packed = false;
    const MessageLite* prototype =
        factory->GetPrototype(descriptor->message_type());
    extension->is_lazy = false;
    extension->message_value = prototype->New();
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(
          *factory->GetPrototype(descriptor->message_type()));
    } else {
      return extension->message_value;
    }
  }
}